

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

void __thiscall tl::StrT<char>::append(StrT<char> *this,CStrT<char> o)

{
  char *pcVar1;
  char cVar2;
  u32 i;
  char *pcVar3;
  ulong uVar4;
  uint newSize;
  uint uVar5;
  u32 i_1;
  u32 i_00;
  CStrT<char> local_38;
  
  local_38._str = o._str;
  uVar5 = o._size;
  newSize = this->_size + uVar5;
  local_38._size = uVar5;
  pcVar3 = growIfNeeded(this,newSize);
  if (pcVar3 != (char *)0x0) {
    for (uVar4 = 0; pcVar1 = this->_str, uVar4 < this->_size; uVar4 = uVar4 + 1) {
      pcVar3[uVar4] = pcVar1[uVar4];
    }
    if (pcVar1 != (char *)0x0 && pcVar1 != &s_emptyStr<char>) {
      operator_delete__(pcVar1);
    }
    this->_str = pcVar3;
  }
  for (i_00 = 0; i_00 < uVar5; i_00 = i_00 + 1) {
    cVar2 = CStrT<char>::operator[](&local_38,i_00);
    this->_str[this->_size + i_00] = cVar2;
    uVar5 = local_38._size;
  }
  this->_str[newSize] = '\0';
  this->_size = newSize;
  return;
}

Assistant:

void StrT<CharT>::append(CStrT<CharT> o)
{
    const u32 newSize = _size + o.size();
    CharT *const newStr = growIfNeeded(newSize);
    if(newStr) {
        for(u32 i=0; i<_size; i++) {
            newStr[i] = _str[i];
        }
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = newStr;
    }
    for(u32 i=0; i<o.size(); i++) {
        _str[_size+i] = o[i];
    }
    _str[newSize] = 0;
    _size = newSize;
}